

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

GCobj * io_std_new(lua_State *L,FILE *fp,char *name)

{
  TValue *pTVar1;
  undefined8 *puVar2;
  GCobj *pGVar3;
  
  puVar2 = (undefined8 *)lua_newuserdata(L,0x10);
  pTVar1 = L->top;
  pGVar3 = (GCobj *)(pTVar1[-1].u64 & 0x7fffffffffff);
  (pGVar3->gch).unused1 = '\x01';
  (pGVar3->th).base = (TValue *)(pTVar1[-3].u64 & 0x7fffffffffff);
  *puVar2 = fp;
  *(undefined4 *)(puVar2 + 1) = 2;
  lua_setfield(L,-2,name);
  return pGVar3;
}

Assistant:

static GCobj *io_std_new(lua_State *L, FILE *fp, const char *name)
{
  IOFileUD *iof = (IOFileUD *)lua_newuserdata(L, sizeof(IOFileUD));
  GCudata *ud = udataV(L->top-1);
  ud->udtype = UDTYPE_IO_FILE;
  /* NOBARRIER: The GCudata is new (marked white). */
  setgcref(ud->metatable, gcV(L->top-3));
  iof->fp = fp;
  iof->type = IOFILE_TYPE_STDF;
  lua_setfield(L, -2, name);
  return obj2gco(ud);
}